

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

int Abc_NtkIsAcyclicWithBoxes(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  Abc_Ntk_t *pAVar2;
  long *plVar3;
  FILE *pFVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  Vec_Ptr_t *pVVar8;
  char *pcVar9;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  Abc_Obj_t *pAVar10;
  long lVar11;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar5 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar5 + 500;
    iVar6 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar6) {
      piVar7 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar7;
      if (piVar7 == (int *)0x0) goto LAB_001cddad;
      (pNtk->vTravIds).nCap = iVar6;
      in_RDX = extraout_RDX;
    }
    if (-500 < iVar5) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
      in_RDX = extraout_RDX_00;
    }
    (pNtk->vTravIds).nSize = iVar6;
  }
  iVar5 = pNtk->nTravIds;
  pNtk->nTravIds = iVar5 + 1;
  if (iVar5 < 0x3fffffff) {
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar5 = pNtk->vObjs->nSize;
      uVar1 = (long)iVar5 + 500;
      iVar6 = (int)uVar1;
      if ((pNtk->vTravIds).nCap < iVar6) {
        piVar7 = (int *)malloc(uVar1 * 4);
        (pNtk->vTravIds).pArray = piVar7;
        if (piVar7 == (int *)0x0) {
LAB_001cddad:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar6;
        in_RDX = extraout_RDX_01;
      }
      if (-500 < iVar5) {
        memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
        in_RDX = extraout_RDX_02;
      }
      (pNtk->vTravIds).nSize = iVar6;
    }
    iVar5 = pNtk->nTravIds;
    pNtk->nTravIds = iVar5 + 1;
    if (iVar5 < 0x3fffffff) {
      pVVar8 = pNtk->vPos;
      if (pVVar8->nSize < 1) {
        iVar5 = 1;
      }
      else {
        iVar5 = 1;
        lVar11 = 0;
        do {
          pAVar10 = *(Abc_Obj_t **)
                     (*(long *)(*(long *)(*pVVar8->pArray[lVar11] + 0x20) + 8) +
                     (long)**(int **)((long)pVVar8->pArray[lVar11] + 0x20) * 8);
          if (pAVar10->pNtk->ntkType == ABC_NTK_NETLIST) {
            pAVar10 = (Abc_Obj_t *)pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanins).pArray];
          }
          if ((*(uint *)&pAVar10->field_0x14 & 0xf) == 5) {
            pAVar10 = (Abc_Obj_t *)pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanins).pArray];
          }
          pAVar2 = pAVar10->pNtk;
          iVar6 = pAVar10->Id;
          Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,(int)in_RDX);
          if (((long)iVar6 < 0) || ((pAVar2->vTravIds).nSize <= iVar6)) goto LAB_001cdd6f;
          in_RDX = extraout_RDX_03;
          if (((pAVar2->vTravIds).pArray[iVar6] != pAVar10->pNtk->nTravIds + -1) &&
             (iVar5 = Abc_NtkIsAcyclicWithBoxes_rec(pAVar10), pFVar4 = _stdout,
             in_RDX = extraout_RDX_04, iVar5 == 0)) {
            pcVar9 = Abc_ObjName((Abc_Obj_t *)
                                 pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanouts).pArray]);
            iVar5 = 0;
            fprintf(pFVar4," PO \"%s\"\n",pcVar9);
            in_RDX = extraout_RDX_05;
            break;
          }
          lVar11 = lVar11 + 1;
          pVVar8 = pNtk->vPos;
        } while (lVar11 < pVVar8->nSize);
      }
      if (iVar5 == 0) {
        iVar5 = 0;
      }
      else {
        pVVar8 = pNtk->vBoxes;
        if (0 < pVVar8->nSize) {
          lVar11 = 0;
          do {
            plVar3 = (long *)pVVar8->pArray[lVar11];
            if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
              plVar3 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                 (long)*(int *)plVar3[4] * 8);
              pAVar10 = *(Abc_Obj_t **)
                         (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
              if (pAVar10->pNtk->ntkType == ABC_NTK_NETLIST) {
                pAVar10 = (Abc_Obj_t *)pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanins).pArray];
              }
              if ((*(uint *)&pAVar10->field_0x14 & 0xf) == 5) {
                pAVar10 = (Abc_Obj_t *)pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanins).pArray];
              }
              pAVar2 = pAVar10->pNtk;
              iVar6 = pAVar10->Id;
              Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,(int)in_RDX);
              if (((long)iVar6 < 0) || ((pAVar2->vTravIds).nSize <= iVar6)) {
LAB_001cdd6f:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              in_RDX = extraout_RDX_06;
              if ((pAVar2->vTravIds).pArray[iVar6] != pAVar10->pNtk->nTravIds + -1) {
                iVar6 = Abc_NtkIsAcyclicWithBoxes_rec(pAVar10);
                pFVar4 = _stdout;
                iVar5 = 1;
                in_RDX = extraout_RDX_07;
                if (iVar6 == 0) {
                  pcVar9 = Abc_ObjName((Abc_Obj_t *)
                                       pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanouts).pArray]);
                  fprintf(pFVar4," PO \"%s\"\n",pcVar9);
                  return 0;
                }
              }
            }
            lVar11 = lVar11 + 1;
            pVVar8 = pNtk->vBoxes;
          } while (lVar11 < pVVar8->nSize);
        }
      }
      return iVar5;
    }
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkIsAcyclicWithBoxes( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int fAcyclic;
    int i;
    // set the traversal ID for this DFS ordering
    Abc_NtkIncrementTravId( pNtk );   
    Abc_NtkIncrementTravId( pNtk );   
    // pNode->TravId == pNet->nTravIds      means "pNode is on the path"
    // pNode->TravId == pNet->nTravIds - 1  means "pNode is visited but is not on the path"
    // pNode->TravId <  pNet->nTravIds - 1  means "pNode is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        pNode = Abc_ObjFanin0Ntk(Abc_ObjFanin0(pNode));
        if ( Abc_ObjIsBo(pNode) )
            pNode = Abc_ObjFanin0(pNode);
        if ( Abc_NodeIsTravIdPrevious(pNode) )
            continue;
        // traverse the output logic cone
        if ( (fAcyclic = Abc_NtkIsAcyclicWithBoxes_rec(pNode)) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, " PO \"%s\"\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        break;
    }
    if ( fAcyclic )
    {
        Abc_NtkForEachLatchInput( pNtk, pNode, i )
        {
            pNode = Abc_ObjFanin0Ntk(Abc_ObjFanin0(pNode));
            if ( Abc_ObjIsBo(pNode) )
                pNode = Abc_ObjFanin0(pNode);
            if ( Abc_NodeIsTravIdPrevious(pNode) )
                continue;
            // traverse the output logic cone
            if ( (fAcyclic = Abc_NtkIsAcyclicWithBoxes_rec(pNode)) )
                continue;
            // stop as soon as the first loop is detected
            fprintf( stdout, " PO \"%s\"\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            break;
        }
    }
    return fAcyclic;
}